

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  ulong *puVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  ulong *puVar12;
  unsigned_long *puVar13;
  ulong *key;
  size_t row;
  undefined8 extraout_XMM0_Qb;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar14;
  tuple<> local_c9;
  size_t *local_c8;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_c0;
  double local_b8;
  unsigned_long local_b0;
  unsigned_long *local_a8;
  ulong *local_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  unsigned_long local_80;
  size_t *local_78;
  double *local_70;
  double local_68;
  unsigned_long local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_98 = (double)Xc_indptr[col_num];
  local_b0 = Xc_indptr[col_num + 1];
  if (local_98 == (double)local_b0) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar12 = ix_arr + st;
  local_a0 = ix_arr + end + 1;
  uVar5 = (long)local_a0 - (long)puVar12 >> 3;
  key = puVar12;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar9 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key[uVar6] < Xc_ind[(long)local_98]) {
        key = key + uVar6 + 1;
        uVar5 = uVar9;
      }
    } while (0 < (long)uVar5);
  }
  local_60 = Xc_ind[local_b0 - 1];
  local_b8 = 0.0;
  local_c8 = ix_arr;
  local_a8 = Xc_ind;
  local_70 = Xc;
  if (st <= end) {
    do {
      local_c0._M_head_impl = puVar12;
      pVar14 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,puVar12,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_c0,&local_c9);
      local_b8 = local_b8 + *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      puVar12 = puVar12 + 1;
    } while (st <= end);
  }
  pdVar4 = local_70;
  puVar3 = local_a8;
  uVar2 = local_b0;
  if (key != local_a0) {
    local_80 = local_b0 - 1;
    local_78 = local_c8 + end;
    uStack_90 = 0;
    local_88 = 0.0;
    local_c8 = (size_t *)0x0;
    dVar8 = local_98;
    uVar11 = local_b0;
    puVar12 = local_a0;
    puVar13 = local_a8;
    local_98 = 0.0;
    while (uVar5 = *key, uVar5 <= local_60) {
      puVar1 = puVar13 + (long)dVar8;
      uVar6 = *puVar1;
      if (uVar6 == uVar5) {
        local_c0._M_head_impl = key;
        if ((ulong)ABS(pdVar4[(long)dVar8]) < 0x7ff0000000000000) {
          pVar14 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_c0,&local_c9);
          local_68 = *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
          local_58 = pdVar4[(long)dVar8];
          uStack_50 = 0;
          local_48 = (double)(~-(ulong)((double)local_c8 == 0.0) & (ulong)local_98 |
                             -(ulong)((double)local_c8 == 0.0) & (ulong)local_58);
          uStack_40 = uStack_90;
          local_c8 = (size_t *)((double)local_c8 + local_68);
          local_98 = fma(local_68,(local_58 - local_98) / (double)local_c8,local_98);
          uStack_90 = extraout_XMM0_Qb;
          local_88 = fma(local_68,(local_58 - local_48) * (local_58 - local_98),local_88);
        }
        else {
          pVar14 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_c0,&local_c9);
          local_b8 = local_b8 - *(double *)((pVar14.first.m_bucket.m_bucket)->m_value + 8);
        }
        if ((key == local_78) || (dVar8 == (double)local_80)) break;
        puVar7 = puVar1 + 1;
        key = key + 1;
        uVar5 = (long)((long)puVar3 + (uVar2 * 8 - (long)puVar7)) >> 3;
        uVar11 = local_b0;
        puVar12 = local_a0;
        puVar13 = local_a8;
        if (0 < (long)uVar5) {
          do {
            uVar6 = uVar5 >> 1;
            uVar9 = ~uVar6 + uVar5;
            uVar5 = uVar6;
            if ((puVar7 + uVar6 + 1)[-1] < *key) {
              puVar7 = puVar7 + uVar6 + 1;
              uVar5 = uVar9;
            }
          } while (0 < (long)uVar5);
        }
LAB_002285c0:
        dVar8 = (double)((long)puVar7 - (long)puVar13 >> 3);
      }
      else {
        if (uVar6 <= uVar5) {
          puVar7 = puVar1 + 1;
          uVar6 = (long)((long)puVar3 + (uVar2 * 8 - (long)(puVar1 + 1))) >> 3;
          while (0 < (long)uVar6) {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if ((puVar7 + uVar9 + 1)[-1] < uVar5) {
              puVar7 = puVar7 + uVar9 + 1;
              uVar6 = uVar10;
            }
          }
          goto LAB_002285c0;
        }
        key = key + 1;
        uVar5 = (long)puVar12 - (long)key >> 3;
        while (0 < (long)uVar5) {
          uVar9 = uVar5 >> 1;
          uVar10 = ~uVar9 + uVar5;
          uVar5 = uVar9;
          if (key[uVar9] < uVar6) {
            key = key + uVar9 + 1;
            uVar5 = uVar10;
          }
        }
      }
      if ((key == puVar12) || (dVar8 == (double)uVar11)) break;
    }
    if (((double)local_c8 != 0.0) || (NAN((double)local_c8))) {
      if ((double)local_c8 < local_b8) {
        local_88 = local_88 +
                   (1.0 - (double)local_c8 / local_b8) * (double)local_c8 * local_98 * local_98;
        local_98 = local_98 * ((double)local_c8 / local_b8);
      }
      *x_mean = local_98;
      dVar8 = SQRT(local_88 / local_b8);
      goto LAB_0022868e;
    }
  }
  *x_mean = 0.0;
  dVar8 = 0.0;
LAB_0022868e:
  *x_sd = dVar8;
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}